

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

void __thiscall
BmsParseInvalidCharAsHeaderOrBarException::BmsParseInvalidCharAsHeaderOrBarException
          (BmsParseInvalidCharAsHeaderOrBarException *this,uint line,string *str)

{
  string *str_local;
  uint line_local;
  BmsParseInvalidCharAsHeaderOrBarException *this_local;
  
  BmsParseInvalidCharException::BmsParseInvalidCharException
            (&this->super_BmsParseInvalidCharException,line,str);
  (this->super_BmsParseInvalidCharException).super_BmsParseException.super_BmsException.
  _vptr_BmsException = (_func_int **)&PTR_Message_abi_cxx11__001ab540;
  return;
}

Assistant:

BmsParseInvalidCharAsHeaderOrBarException::BmsParseInvalidCharAsHeaderOrBarException( unsigned int line, const std::string& str ) :
BmsParseInvalidCharException( line, str )
{
}